

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# swipe.cc
# Opt level: O1

void sptk::swipe::Sfirst(matrix S,vector x,vector pc,vector fERBs,vector d,intvector ws,intvector ps
                        ,double nyquist,double nyquist2,double dt,int n)

{
  vector pci;
  vector mu;
  uint xSz;
  ulong uVar1;
  double *pdVar2;
  double **extraout_RDX;
  double *extraout_RDX_00;
  double *extraout_RDX_01;
  int w2;
  vector fERBs_00;
  matrix L;
  vector vVar4;
  vector vVar5;
  vector yr_vector;
  matrix yr_matrix;
  vector yr_vector_00;
  vector yr_vector_01;
  undefined4 uStack_4c;
  undefined4 uStack_3c;
  double *pdVar3;
  
  w2 = ws.v[n] / 2;
  vVar5._4_4_ = 0;
  vVar5.x = fERBs.x;
  vVar4._4_4_ = 0;
  vVar4.x = x.x;
  vVar4.v = x.v;
  vVar5.v = fERBs.v;
  L = loudness(vVar4,vVar5,nyquist,ws.v[n],w2);
  yr_vector.v = L.m;
  yr_vector._0_8_ = d.v;
  xSz = bisectv((swipe *)(ulong)(uint)d.x,yr_vector,2.0);
  vVar4 = makev(xSz);
  pdVar2 = vVar4.v;
  vVar5 = makev(xSz);
  pdVar3 = vVar5.v;
  if (0 < (int)xSz) {
    uVar1 = 0;
    do {
      pdVar3[uVar1] = pc.v[uVar1];
      pdVar2[uVar1] = 1.0 - ABS(d.v[uVar1] + -1.0);
      uVar1 = uVar1 + 1;
    } while (xSz != uVar1);
  }
  mu._4_4_ = uStack_4c;
  mu.x = vVar4.x;
  pci._4_4_ = uStack_3c;
  pci.x = vVar5.x;
  fERBs_00._4_4_ = 0;
  fERBs_00.x = fERBs.x;
  pci.v = pdVar3;
  mu.v = pdVar2;
  fERBs_00.v = fERBs.v;
  Sadd(S,L,fERBs_00,pci,mu,ps,dt,nyquist2,0,xSz,w2);
  yr_matrix.m = extraout_RDX;
  yr_matrix._0_8_ = yr_vector.v;
  freem(L._0_8_,yr_matrix);
  yr_vector_00.v = extraout_RDX_00;
  yr_vector_00._0_8_ = pdVar2;
  freev((swipe *)(ulong)(uint)vVar4.x,yr_vector_00);
  yr_vector_01.v = extraout_RDX_01;
  yr_vector_01._0_8_ = pdVar3;
  freev((swipe *)(ulong)(uint)vVar5.x,yr_vector_01);
  return;
}

Assistant:

void Sfirst(matrix S, vector x, vector pc, vector fERBs, vector d, 
                                           intvector ws, intvector ps, 
                                           double nyquist, double nyquist2,
                                           double dt, int n) {
    int i; 
    int w2 = ws.v[n] / 2;
    matrix L = loudness(x, fERBs, nyquist, ws.v[n], w2);
    int lo = 0; // the start of Sfirst-specific code
    int hi = bisectv(d, 2.);
    int psz = hi - lo;
    vector mu = makev(psz);
    vector pci = makev(psz);
    for (i = 0; i < hi; i++) {
        pci.v[i] = pc.v[i];
        mu.v[i] = 1. - fabs(d.v[i] - 1.);
    } // end of Sfirst-specific code
    Sadd(S, L, fERBs, pci, mu, ps, dt, nyquist2, lo, psz, w2); 
    freem(L);
    freev(mu);
    freev(pci); 
}